

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O0

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::process_settings>::stats
          (mem_cache<cppcms::impl::process_settings> *this,uint *keys,uint *triggers)

{
  shared_mutex *in_RDX;
  shared_guard *in_RSI;
  long in_RDI;
  rdlock_guard lock;
  unique_ptr<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>
  *in_stack_ffffffffffffffe0;
  
  std::unique_ptr<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>::
  operator*(in_stack_ffffffffffffffe0);
  shared_mutex::shared_guard::shared_guard(in_RSI,in_RDX);
  *(int *)&in_RSI->m_ = (int)*(undefined8 *)(in_RDI + 200);
  *(int *)&in_RDX->plock_ = (int)*(undefined8 *)(in_RDI + 0xd0);
  shared_mutex::shared_guard::~shared_guard((shared_guard *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

virtual void stats(unsigned &keys,unsigned &triggers)
	{
		rdlock_guard lock(*access_lock);
		keys=size;
		triggers = triggers_count;
	}